

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.hpp
# Opt level: O2

bool __thiscall lan::db::iterate<int>(db *this,string *target,int value,db_bit_type type)

{
  db_bit *context;
  bool bVar1;
  db_bits *pdVar2;
  invalid_argument *this_00;
  string *this_01;
  string sStack_c8;
  string local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,(string *)target);
  pdVar2 = find_rec(this,&local_48,Container,Array,this->first);
  this->data = pdVar2;
  std::__cxx11::string::~string((string *)&local_48);
  if (pdVar2 != (db_bits *)0x0) {
    context = this->data;
    if (context->lin == (db_bit *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"",(allocator<char> *)&sStack_c8);
      bVar1 = init_iter<int>(this,context,&local_a8,value,type);
      this_01 = &local_a8;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"",(allocator<char> *)&sStack_c8);
      bVar1 = append_iter<int>(this,context,&local_88,value,type);
      this_01 = &local_88;
    }
    std::__cxx11::string::~string((string *)this_01);
    return bVar1;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_68,target,"{a}");
  error_string(&sStack_c8,this,_bit_name_error,&local_68);
  std::invalid_argument::invalid_argument(this_00,(string *)&sStack_c8);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool iterate(std::string const target, any const value, db_bit_type const type){
            if((data = find_rec(target, lan::Container, lan::Array, first))) {
                return (data->lin) ? append_iter(data, "", value, type) :
                init_iter(data, "", value, type);
            } throw lan::errors::bit_name_error(error_string(errors::_private::_bit_name_error, target+"{a}"));
        }